

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O0

int sf(frameex1 *fx_addr68k)

{
  ushort uVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  DLword DVar4;
  bool bVar5;
  int local_64;
  LispPTR ivarindex;
  int localivar;
  fnhead *fnobj;
  LispPTR local_50;
  ushort local_4c;
  DLword nfvar;
  LispPTR pvarindex;
  DLword max_npvar;
  DLword npvar;
  int i;
  LispPTR atomindex;
  DLword *ptrlo;
  DLword *ptrhi;
  DLword *ptr;
  DLword *next68k;
  Bframe *bf;
  frameex1 *fx_addr68k_local;
  
  BT_lines = 0;
  if (fx_addr68k == (frameex1 *)0x0) {
    fx_addr68k_local._4_4_ = -1;
  }
  else {
    bf = (Bframe *)fx_addr68k;
    if (*(ushort *)&fx_addr68k->field_0x2 >> 0xd == 6) {
      if ((fx_addr68k->alink & 1) == 0) {
        next68k = &fx_addr68k[-1].clink;
      }
      else {
        next68k = (DLword *)NativeAligned4FromStackOffset(fx_addr68k->blink);
      }
      printf("IVAR -------\n");
      BT_lines = BT_lines + 1;
      if (0x1e < BT_lines) {
        printf("Press Return(to quit Esc and Ret):");
        BT_temp = getchar();
        fflush(_stdin);
        BT_lines = 0;
        if (BT_temp == 0x1b) {
          longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
        }
      }
      ptrhi = NativeAligned2FromStackOffset(*next68k);
      pvarindex = 0;
      for (; ptrhi != next68k; ptrhi = ptrhi + 2) {
        _i = ptrhi + 1;
        LVar2 = LAddrFromNative(ptrhi);
        printf(" %6x : 0x%4x  0x%4x  ",(ulong)LVar2,(ulong)*(ushort *)((ulong)ptrhi ^ 2),
               (ulong)*(ushort *)((ulong)_i ^ 2));
        DVar4 = (DLword)pvarindex;
        pvarindex = pvarindex + 1;
        LVar2 = get_ivar_name((frameex1 *)bf,DVar4,&local_64);
        if (local_64 == 1) {
          printf("*local* ");
        }
        print_atomname(LVar2);
        printf("  ");
        print(*(LispPTR *)ptrhi);
        putchar(10);
        BT_lines = BT_lines + 1;
        if (0x1e < BT_lines) {
          printf("Press Return(to quit Esc and Ret):");
          BT_temp = getchar();
          fflush(_stdin);
          BT_lines = 0;
          if (BT_temp == 0x1b) {
            longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
          }
        }
      }
      putchar(10);
      BT_lines = BT_lines + 1;
      if (0x1e < BT_lines) {
        printf("Press Return(to quit Esc and Ret):");
        BT_temp = getchar();
        fflush(_stdin);
        BT_lines = 0;
        if (BT_temp == 0x1b) {
          longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
        }
      }
      LVar2 = LAddrFromNative(next68k);
      printf("## STACK BF at 0x%x ##\n",(ulong)LVar2);
      BT_lines = BT_lines + 1;
      if (0x1e < BT_lines) {
        printf("Press Return(to quit Esc and Ret):");
        BT_temp = getchar();
        fflush(_stdin);
        BT_lines = 0;
        if (BT_temp == 0x1b) {
          longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
        }
      }
      if (next68k[1] >> 0xd == 4) {
        putchar(0x5b);
        if ((next68k[1] >> 9 & 1) != 0) {
          printf("Res, ");
        }
        if ((next68k[1] >> 8 & 1) != 0) {
          printf("Pad, ");
        }
        printf("cnt=%d ]\n",(ulong)(next68k[1] & 0xff));
        BT_lines = BT_lines + 1;
        if (0x1e < BT_lines) {
          printf("Press Return(to quit Esc and Ret):");
          BT_temp = getchar();
          fflush(_stdin);
          BT_lines = 0;
          if (BT_temp == 0x1b) {
            longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
          }
        }
        printf("ivar : 0x%x\n",(ulong)*next68k);
        BT_lines = BT_lines + 1;
        if (0x1e < BT_lines) {
          printf("Press Return(to quit Esc and Ret):");
          BT_temp = getchar();
          fflush(_stdin);
          BT_lines = 0;
          if (BT_temp == 0x1b) {
            longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
          }
        }
        uVar1 = *next68k;
        LVar2 = LAddrFromNative(MachineState.ivar);
        printf(">> Bf\'s ivar says 0x%x vs. IVar says 0x%x\n",(ulong)(uVar1 + 0x10000),(ulong)LVar2)
        ;
        BT_lines = BT_lines + 1;
        if (0x1e < BT_lines) {
          printf("Press Return(to quit Esc and Ret):");
          BT_temp = getchar();
          fflush(_stdin);
          BT_lines = 0;
          if (BT_temp == 0x1b) {
            longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
          }
        }
        _max_npvar = get_framename((frameex1 *)bf);
        printf("Fname is ");
        print(_max_npvar);
        printf("\n");
        BT_lines = BT_lines + 1;
        if (0x1e < BT_lines) {
          printf("Press Return(to quit Esc and Ret):");
          BT_temp = getchar();
          fflush(_stdin);
          BT_lines = 0;
          if (BT_temp == 0x1b) {
            longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
          }
        }
        LVar2 = LAddrFromNative(bf);
        printf("## STACK FX at 0x%x ##\n",(ulong)LVar2);
        BT_lines = BT_lines + 1;
        if (0x1e < BT_lines) {
          printf("Press Return(to quit Esc and Ret):");
          BT_temp = getchar();
          fflush(_stdin);
          BT_lines = 0;
          if (BT_temp == 0x1b) {
            longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
          }
        }
        if (*(ushort *)&bf->field_0x2 >> 0xd == 6) {
          putchar(0x5b);
          if ((*(ushort *)&bf->field_0x2 >> 0xc & 1) != 0) {
            printf("F, ");
          }
          if ((*(ushort *)&bf->field_0x2 >> 10 & 1) != 0) {
            printf("incall, ");
          }
          if ((*(ushort *)&bf->field_0x2 >> 9 & 1) != 0) {
            printf("V, ");
          }
          printf("cnt = %d ]\n",(ulong)(*(ushort *)&bf->field_0x2 & 0xff));
          BT_lines = BT_lines + 1;
          if (0x1e < BT_lines) {
            printf("Press Return(to quit Esc and Ret):");
            BT_temp = getchar();
            fflush(_stdin);
            BT_lines = 0;
            if (BT_temp == 0x1b) {
              longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
            }
          }
          printf(" #alink           0x%x ",(ulong)bf->ivar);
          if ((bf->ivar & 1) == 0) {
            printf("\n");
          }
          else {
            printf("[SLOWP]\n");
          }
          BT_lines = BT_lines + 1;
          if (0x1e < BT_lines) {
            printf("Press Return(to quit Esc and Ret):");
            BT_temp = getchar();
            fflush(_stdin);
            BT_lines = 0;
            if (BT_temp == 0x1b) {
              longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
            }
          }
          printf(" fnhead   0x%x \n",(ulong)(uint)bf[1]);
          BT_lines = BT_lines + 1;
          if (0x1e < BT_lines) {
            printf("Press Return(to quit Esc and Ret):");
            BT_temp = getchar();
            fflush(_stdin);
            BT_lines = 0;
            if (BT_temp == 0x1b) {
              longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
            }
          }
          printf(" nextblock        0x%x \n",(ulong)*(ushort *)&bf[2].field_0x2);
          BT_lines = BT_lines + 1;
          if (0x1e < BT_lines) {
            printf("Press Return(to quit Esc and Ret):");
            BT_temp = getchar();
            fflush(_stdin);
            BT_lines = 0;
            if (BT_temp == 0x1b) {
              longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
            }
          }
          printf(" pc               0x%x \n",(ulong)bf[2].ivar);
          BT_lines = BT_lines + 1;
          if (0x1e < BT_lines) {
            printf("Press Return(to quit Esc and Ret):");
            BT_temp = getchar();
            fflush(_stdin);
            BT_lines = 0;
            if (BT_temp == 0x1b) {
              longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
            }
          }
          printf(" nametbl  0x%x \n",(ulong)(uint)bf[3]);
          BT_lines = BT_lines + 1;
          if (0x1e < BT_lines) {
            printf("Press Return(to quit Esc and Ret):");
            BT_temp = getchar();
            fflush(_stdin);
            BT_lines = 0;
            if (BT_temp == 0x1b) {
              longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
            }
          }
          printf(" #blink           0x%x \n",(ulong)*(ushort *)&bf[4].field_0x2);
          BT_lines = BT_lines + 1;
          if (0x1e < BT_lines) {
            printf("Press Return(to quit Esc and Ret):");
            BT_temp = getchar();
            fflush(_stdin);
            BT_lines = 0;
            if (BT_temp == 0x1b) {
              longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
            }
          }
          printf(" #clink           0x%x \n",(ulong)bf[4].ivar);
          BT_lines = BT_lines + 1;
          if (0x1e < BT_lines) {
            printf("Press Return(to quit Esc and Ret):");
            BT_temp = getchar();
            fflush(_stdin);
            BT_lines = 0;
            if (BT_temp == 0x1b) {
              longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
            }
          }
          _ivarindex = NativeAligned4FromLAddr((LispPTR)bf[1]);
          local_4c = (ushort)_ivarindex[3] >> 8;
          if ((_ivarindex[3] & 0xff) == 0) {
            fnobj._6_2_ = 0;
          }
          else {
            fnobj._6_2_ = (ushort)*(undefined4 *)
                                   ((long)_ivarindex +
                                   (long)(int)(uint)*(ushort *)((long)_ivarindex + 0xe) * 2 +
                                   (long)(int)(uint)((ushort)_ivarindex[3] & 0xff) * 2);
          }
          nfvar = local_4c;
          if (bf == (Bframe *)(MachineState.pvar + -10)) {
            ptrhi = MachineState.pvar;
            pvarindex = 0;
            while (nfvar != 0) {
              ptrlo = ptrhi;
              _i = ptrhi + 1;
              nfvar = nfvar - 1;
              LVar2 = LAddrFromNative(ptrhi);
              printf(" %6x : 0x%4x  0x%4x  ",(ulong)LVar2,(ulong)*(ushort *)((ulong)ptrlo ^ 2),
                     (ulong)*(ushort *)((ulong)_i ^ 2));
              DVar4 = (DLword)pvarindex;
              pvarindex = pvarindex + 1;
              local_50 = get_pvar_name((frameex1 *)bf,DVar4);
              if (local_50 == 0xffff) {
                printf("*local* [pvar%d] ",(ulong)(pvarindex - 1));
              }
              else {
                print_atomname(local_50);
              }
              if (*(short *)((ulong)ptrhi ^ 2) == -1) {
                printf("  [variable not bound]\n");
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              else {
                printf("  ");
                print(*(LispPTR *)ptrhi);
                putchar(10);
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              ptrhi = ptrhi + 2;
            }
            pvarindex = (LispPTR)local_4c;
            nfvar = nfvar - 1;
            while( true ) {
              uVar1 = fnobj._6_2_;
              bVar5 = fnobj._6_2_ != 0;
              if (bVar5) {
                fnobj._6_2_ = fnobj._6_2_ - 1;
              }
              if (!bVar5 || uVar1 < local_4c) break;
              ptrlo = ptrhi;
              _i = ptrhi + 1;
              LVar2 = LAddrFromNative(ptrhi);
              printf(" %6x : 0x%4x  0x%4x  ",(ulong)LVar2,(ulong)*(ushort *)((ulong)ptrlo ^ 2),
                     (ulong)*(ushort *)((ulong)_i ^ 2));
              if (*(short *)((ulong)ptrlo ^ 2) == -1) {
                printf("[not looked up]  ");
                LVar2 = get_fvar_name((frameex1 *)bf,(DLword)pvarindex);
                print_atomname(LVar2);
                putchar(10);
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              else if (*(short *)((ulong)_i ^ 2) == 1) {
                printf("[fvar  ");
                LVar2 = get_fvar_name((frameex1 *)bf,(DLword)pvarindex);
                print_atomname(LVar2);
                printf("  on stack]  ");
                pLVar3 = NativeAligned4FromLAddr
                                   ((*(ushort *)((ulong)_i ^ 2) & 0xf) << 0x10 |
                                    (uint)*(ushort *)((ulong)ptrlo ^ 2));
                print(*pLVar3);
                putchar(10);
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              else {
                printf("[fvar  ");
                LVar2 = get_fvar_name((frameex1 *)bf,(DLword)pvarindex);
                print_atomname(LVar2);
                printf("  top value ]   ");
                pLVar3 = NativeAligned4FromLAddr
                                   ((*(ushort *)((ulong)_i ^ 2) & 0xfff) << 0x10 |
                                    (uint)*(ushort *)((ulong)ptrlo ^ 2));
                print(*pLVar3);
                putchar(10);
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              ptrhi = ptrhi + 2;
              pvarindex = pvarindex + 1;
            }
            if (bf->ivar == 0xb) {
              ptr = NativeAligned2FromStackOffset(*(DLword *)&bf[2].field_0x2);
            }
            else {
              ptr = MachineState.csp;
            }
            while (ptrhi < ptr) {
              ptrlo = ptrhi;
              _i = ptrhi + 1;
              LVar2 = LAddrFromNative(ptrhi);
              printf(" %6x : 0x%4x  0x%4x  ",(ulong)LVar2,(ulong)*(ushort *)((ulong)ptrlo ^ 2),
                     (ulong)*(ushort *)((ulong)_i ^ 2));
              print(*(LispPTR *)ptrhi);
              ptrhi = ptrhi + 2;
              putchar(10);
              BT_lines = BT_lines + 1;
              if (0x1e < BT_lines) {
                printf("Press Return(to quit Esc and Ret):");
                BT_temp = getchar();
                fflush(_stdin);
                BT_lines = 0;
                if (BT_temp == 0x1b) {
                  longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                }
              }
            }
            printf("this frame is last !!\n");
            BT_lines = BT_lines + 1;
            if (0x1e < BT_lines) {
              printf("Press Return(to quit Esc and Ret):");
              BT_temp = getchar();
              fflush(_stdin);
              BT_lines = 0;
              if (BT_temp == 0x1b) {
                longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
              }
            }
            fx_addr68k_local._4_4_ = -1;
          }
          else {
            ptr = NativeAligned2FromStackOffset(*(DLword *)&bf[2].field_0x2);
            ptrhi = &bf[5].ivar;
            pvarindex = 0;
            while (nfvar != 0) {
              ptrlo = ptrhi;
              _i = ptrhi + 1;
              nfvar = nfvar - 1;
              LVar2 = LAddrFromNative(ptrhi);
              printf(" %6x : 0x%4x  0x%4x  ",(ulong)LVar2,(ulong)*(ushort *)((ulong)ptrlo ^ 2),
                     (ulong)*(ushort *)((ulong)_i ^ 2));
              DVar4 = (DLword)pvarindex;
              pvarindex = pvarindex + 1;
              local_50 = get_pvar_name((frameex1 *)bf,DVar4);
              if (local_50 == 0xffff) {
                printf("*local* [pvar%d] ",(ulong)(pvarindex - 1));
              }
              else {
                print_atomname(local_50);
              }
              if (*(short *)((ulong)ptrhi ^ 2) == -1) {
                printf("  [variable not bound]\n");
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              else {
                printf("  ");
                print(*(LispPTR *)ptrhi);
                putchar(10);
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              ptrhi = ptrhi + 2;
            }
            pvarindex = (LispPTR)local_4c;
            nfvar = nfvar - 1;
            while( true ) {
              uVar1 = fnobj._6_2_;
              bVar5 = fnobj._6_2_ != 0;
              if (bVar5) {
                fnobj._6_2_ = fnobj._6_2_ - 1;
              }
              if (!bVar5 || uVar1 < local_4c) break;
              ptrlo = ptrhi;
              _i = ptrhi + 1;
              LVar2 = LAddrFromNative(ptrhi);
              printf(" %6x : 0x%4x  0x%4x  ",(ulong)LVar2,(ulong)*(ushort *)((ulong)ptrlo ^ 2),
                     (ulong)*(ushort *)((ulong)_i ^ 2));
              if (*(short *)((ulong)ptrlo ^ 2) == -1) {
                printf("[not looked up]  ");
                LVar2 = get_fvar_name((frameex1 *)bf,(DLword)pvarindex);
                print_atomname(LVar2);
                putchar(10);
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              else if (*(short *)((ulong)_i ^ 2) == 1) {
                printf("[fvar  ");
                LVar2 = get_fvar_name((frameex1 *)bf,(DLword)pvarindex);
                print_atomname(LVar2);
                printf("  on stack]  ");
                pLVar3 = NativeAligned4FromLAddr
                                   ((*(ushort *)((ulong)_i ^ 2) & 0xf) << 0x10 |
                                    (uint)*(ushort *)((ulong)ptrlo ^ 2));
                print(*pLVar3);
                putchar(10);
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              else {
                printf("[fvar  ");
                LVar2 = get_fvar_name((frameex1 *)bf,(DLword)pvarindex);
                print_atomname(LVar2);
                printf("  top value ]   ");
                pLVar3 = NativeAligned4FromLAddr
                                   ((*(ushort *)((ulong)_i ^ 2) & 0xf) << 0x10 |
                                    (uint)*(ushort *)((ulong)ptrlo ^ 2));
                print(*pLVar3);
                putchar(10);
                BT_lines = BT_lines + 1;
                if (0x1e < BT_lines) {
                  printf("Press Return(to quit Esc and Ret):");
                  BT_temp = getchar();
                  fflush(_stdin);
                  BT_lines = 0;
                  if (BT_temp == 0x1b) {
                    longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                  }
                }
              }
              ptrhi = ptrhi + 2;
              pvarindex = pvarindex + 1;
            }
            for (; ptrhi < ptr; ptrhi = ptrhi + 2) {
              ptrlo = ptrhi;
              _i = ptrhi + 1;
              LVar2 = LAddrFromNative(ptrhi);
              printf(" %6x : 0x%4x  0x%4x  ",(ulong)LVar2,(ulong)*(ushort *)((ulong)ptrlo ^ 2),
                     (ulong)*(ushort *)((ulong)_i ^ 2));
              putchar(10);
              BT_lines = BT_lines + 1;
              if (0x1e < BT_lines) {
                printf("Press Return(to quit Esc and Ret):");
                BT_temp = getchar();
                fflush(_stdin);
                BT_lines = 0;
                if (BT_temp == 0x1b) {
                  longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
                }
              }
            }
            fx_addr68k_local._4_4_ = 0;
          }
        }
        else {
          printf("Invalid frame, NOT FX\n");
          fx_addr68k_local._4_4_ = -1;
        }
      }
      else {
        printf("Invalid frame, NOT a BX\n");
        fx_addr68k_local._4_4_ = -1;
      }
    }
    else {
      LVar2 = LAddrFromNative(fx_addr68k);
      printf("Invalid FX 0x%x, flags = 0x%x.\n",(ulong)LVar2,
             (ulong)(*(ushort *)&bf->field_0x2 >> 0xd));
      fx_addr68k_local._4_4_ = -1;
    }
  }
  return fx_addr68k_local._4_4_;
}

Assistant:

int sf(struct frameex1 *fx_addr68k) {
  Bframe *bf;
  DLword *next68k;
  DLword *ptr;
  DLword *ptrhi;
  DLword *ptrlo;
  LispPTR atomindex;
  int i;
  DLword npvar;
  DLword max_npvar;
  LispPTR pvarindex;
  DLword nfvar;
  struct fnhead *fnobj;
  int localivar;
  LispPTR ivarindex;

  BT_lines = 0;

  if ((UNSIGNED)fx_addr68k == 0) return (-1);
  if ((fx_addr68k)->flags != STK_FX) {
    printf("Invalid FX 0x%x, flags = 0x%x.\n", LAddrFromNative(fx_addr68k), (fx_addr68k)->flags);
    return (-1);
  }

  if (((fx_addr68k)->alink & 1) == 0) { /* FAST */
    bf = (Bframe *)(((DLword *)fx_addr68k) - 2);
  } else { /* SLOW */
    bf = (Bframe *)NativeAligned4FromStackOffset((fx_addr68k)->blink);
  }

  /* Print IVARs */
  printf("IVAR -------\n");
  BT_morep;

  ptr = NativeAligned2FromStackOffset(bf->ivar);
  i = 0;
  while (ptr != (DLword *)bf) {
    ptrlo = ptr + 1;
    printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptrlo));
    ivarindex = get_ivar_name(fx_addr68k, i++, &localivar);
    if (localivar == 1) printf("*local* ");
    print_atomname(ivarindex);
    printf("  ");
    print(*(LispPTR *)ptr);
    putchar('\n');
    BT_morep;
    ptr += 2;
  }
  putchar('\n');
  BT_morep;
  printf("## STACK BF at 0x%x ##\n", (LispPTR)LAddrFromNative(bf));
  BT_morep;

  /* print BF  */
  if (bf->flags != 4) {
    printf("Invalid frame, NOT a BX\n");
    return (-1);
  }
  putchar('[');
  if (bf->residual) printf("Res, ");
  if (bf->padding) printf("Pad, ");
  printf("cnt=%d ]\n", bf->usecnt);
  BT_morep;
  printf("ivar : 0x%x\n", bf->ivar);
  BT_morep;

  printf(">> Bf's ivar says 0x%x vs. IVar says 0x%x\n", bf->ivar + STK_OFFSET,
         LAddrFromNative(IVar));
  BT_morep;

  atomindex = get_framename(fx_addr68k);
  printf("Fname is ");
  print(atomindex);
  printf("\n");
  BT_morep;

  /***** printout FX ****/
  printf("## STACK FX at 0x%x ##\n", LAddrFromNative(fx_addr68k));
  BT_morep;

  if ((fx_addr68k)->flags != 6) {
    printf("Invalid frame, NOT FX\n");
    return (-1);
  }

  putchar('[');
  if ((fx_addr68k)->fast) printf("F, ");
  if ((fx_addr68k)->incall) printf("incall, ");
  if (fx_addr68k->validnametable) printf("V, ");
  printf("cnt = %d ]\n", fx_addr68k->usecount);
  BT_morep;

  printf(" #alink           0x%x ", fx_addr68k->alink);

  if (fx_addr68k->alink & 1)
    printf("[SLOWP]\n");
  else
    printf("\n");

  BT_morep;

#ifdef BIGVM
  printf(" fnhead   0x%x \n", fx_addr68k->fnheader);
  BT_morep;
#else
  printf(" fnheadlo         0x%x \n", fx_addr68k->lofnheader);
  BT_morep;
  printf(" hi1,hi2 fnhead   0x%x , 0x%x \n", fx_addr68k->hi1fnheader, fx_addr68k->hi2fnheader);
  BT_morep;
#endif /* BIGVM */
  printf(" nextblock        0x%x \n", fx_addr68k->nextblock);
  BT_morep;
  printf(" pc               0x%x \n", fx_addr68k->pc);
  BT_morep;
#ifdef BIGVM
  printf(" nametbl  0x%x \n", fx_addr68k->nametable);
  BT_morep;
#else
  printf(" lonametbl        0x%x \n", fx_addr68k->lonametable);
  BT_morep;
  printf(" hi1,hi2 nametbl  0x%x , 0x%x  \n", fx_addr68k->hi1nametable, fx_addr68k->hi2nametable);
  BT_morep;
#endif /* BIGVM */
  printf(" #blink           0x%x \n", fx_addr68k->blink);
  BT_morep;
  printf(" #clink           0x%x \n", fx_addr68k->clink);
  BT_morep;

/* added by NMitani 26 Aug 87 */

#ifdef BIGVM
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx_addr68k->fnheader);
#else
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)fx_addr68k->hi2fnheader << 16) |
                                              fx_addr68k->lofnheader);
#endif                                /* BIGVM */
  max_npvar = npvar = fnobj->nlocals; /* npvar is number of Pvars */
  if (fnobj->fvaroffset)
#ifdef BIGATOMS
    nfvar = *((NAMETABLE *)((DLword *)fnobj + fnobj->fvaroffset + fnobj->ntsize)) & NT_OFFSET_MASK;
#else
    nfvar = GETWORD((NAMETABLE *)((DLword *)fnobj + fnobj->fvaroffset + fnobj->ntsize)) &
            NT_OFFSET_MASK;
#endif /* BIGATOMS */

  else
    nfvar = 0;

  if (fx_addr68k == CURRENTFX) {
    ptr = PVar;
    i = 0;
    while (npvar-- > 0) {
      ptrhi = ptr;
      ptrlo = ptr + 1;
      printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
      if ((pvarindex = get_pvar_name(fx_addr68k, i++)) == LOCAL_PVAR)
        printf("*local* [pvar%d] ", (i - 1));
      else
        print_atomname(pvarindex);
      if (GETWORD(ptr) == 0xFFFF) {
        printf("  [variable not bound]\n");
        BT_morep;
      } else {
        printf("  ");
        print(*(LispPTR *)ptr);
        putchar('\n');
        BT_morep;
      }
      ptr += 2;
    }
    i = max_npvar;
    while (nfvar && nfvar-- >= max_npvar) {
      ptrhi = ptr;
      ptrlo = ptr + 1;
      printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
      if (0xFFFF == GETWORD(ptrhi)) {
        printf("[not looked up]  ");
        print_atomname(get_fvar_name(fx_addr68k, i));
        putchar('\n');
        BT_morep;
      } else if ((0xFFFF & GETWORD(ptrlo)) == 1) {
        printf("[fvar  ");
        print_atomname(get_fvar_name(fx_addr68k, i));
        printf("  on stack]  ");
        print(*(LispPTR *)NativeAligned4FromLAddr(((int)(0x0F & GETWORD(ptrlo)) << 16) | GETWORD(ptrhi)));
        putchar('\n');
        BT_morep;
      } else {
        printf("[fvar  ");
        print_atomname(get_fvar_name(fx_addr68k, i));
        printf("  top value ]   ");
        print(*(LispPTR *)NativeAligned4FromLAddr(((int)(0xFFF & GETWORD(ptrlo)) << 16) | GETWORD(ptrhi)));
        putchar('\n');
        BT_morep;
      }
      ptr += 2;
      i++;
    }
    if (fx_addr68k->alink == 11) /* for contextsw */
      next68k = NativeAligned2FromStackOffset(fx_addr68k->nextblock);

    else
      next68k = CurrentStackPTR;
    while (ptr < next68k) {
      ptrhi = ptr;
      ptrlo = ptr + 1;
      printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
      print(*(LispPTR *)ptr);
      ptr += 2;
      putchar('\n');
      BT_morep;
    }
    printf("this frame is last !!\n");
    BT_morep;
    return (-1);
  }

  next68k = NativeAligned2FromStackOffset(fx_addr68k->nextblock);
  ptr = (DLword *)(fx_addr68k + 1);

  i = 0;
  while (npvar-- > 0) {
    ptrhi = ptr;
    ptrlo = ptr + 1;
    printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
    if ((pvarindex = get_pvar_name(fx_addr68k, i++)) == LOCAL_PVAR)
      printf("*local* [pvar%d] ", (i - 1));
    else
      print_atomname(pvarindex);
    if (GETWORD(ptr) == 0xFFFF) {
      printf("  [variable not bound]\n");
      BT_morep;
    } else {
      printf("  ");
      print(*(LispPTR *)ptr);
      putchar('\n');
      BT_morep;
    }
    ptr += 2;
  }
  i = max_npvar;

  while (nfvar && nfvar-- >= max_npvar) {
    ptrhi = ptr;
    ptrlo = ptr + 1;
    printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
    if (0xFFFF == GETWORD(ptrhi)) {
      printf("[not looked up]  ");
      print_atomname(get_fvar_name(fx_addr68k, i));
      putchar('\n');
      BT_morep;
    } else if ((0xFFFF & GETWORD(ptrlo)) == 1) {
      printf("[fvar  ");
      print_atomname(get_fvar_name(fx_addr68k, i));
      printf("  on stack]  ");
      print(*(LispPTR *)NativeAligned4FromLAddr(((int)(0x0F & GETWORD(ptrlo)) << 16) | GETWORD(ptrhi)));
      putchar('\n');
      BT_morep;
    } else {
      printf("[fvar  ");
      print_atomname(get_fvar_name(fx_addr68k, i));
      printf("  top value ]   ");
      print(*(LispPTR *)NativeAligned4FromLAddr(((int)(0x0F & GETWORD(ptrlo)) << 16) | GETWORD(ptrhi)));
      putchar('\n');
      BT_morep;
    }
    ptr += 2;
    i++;
  }

  while (next68k > ptr) {
    ptrhi = ptr;
    ptrlo = ptr + 1;
    printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
    putchar('\n');
    BT_morep;
    ptr += 2;
  }
  return (0);
}